

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolJPolValPair.cpp
# Opt level: O1

void __thiscall
PolicyPoolJPolValPair::Insert(PolicyPoolJPolValPair *this,PolicyPoolItemInterface_sharedPtr *ppi)

{
  undefined8 *puVar1;
  JointPolicyValuePair_sharedPtr jp;
  value_type local_20;
  
  boost::dynamic_pointer_cast<JointPolicyValuePair,PolicyPoolItemInterface>((boost *)&local_20,ppi);
  if (local_20.px != (element_type *)0x0) {
    std::
    priority_queue<boost::shared_ptr<JointPolicyValuePair>,_std::vector<boost::shared_ptr<JointPolicyValuePair>,_std::allocator<boost::shared_ptr<JointPolicyValuePair>_>_>,_std::less<boost::shared_ptr<JointPolicyValuePair>_>_>
    ::push(this->_m_jpvpQueue_p,&local_20);
    boost::detail::shared_count::~shared_count(&local_20.pn);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar1 = &PTR__E_0059bd80;
  puVar1[1] = puVar1 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar1 + 1),
             "PolicyPoolJPolValPair::Insert could not cast input to JointPolicyValuePair","");
  __cxa_throw(puVar1,&E::typeinfo,E::~E);
}

Assistant:

void PolicyPoolJPolValPair::Insert(PolicyPoolItemInterface_sharedPtr  ppi)
{
    JointPolicyValuePair_sharedPtr jp = boost::dynamic_pointer_cast<JointPolicyValuePair>(ppi);

    if(jp==0)
        throw(E("PolicyPoolJPolValPair::Insert could not cast input to JointPolicyValuePair"));

    _m_jpvpQueue_p->push(jp);
    
}